

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

_Bool rsa_ssh1_encrypt(uchar *data,int length,RSAKey *key)

{
  int iVar1;
  uint8_t uVar2;
  long lVar3;
  mp_int *pmVar4;
  mp_int *pmVar5;
  size_t sVar6;
  size_t __n;
  ptrlen bytes;
  
  iVar1 = key->bytes;
  if (length + 4 <= iVar1) {
    __n = (size_t)length;
    memmove(data + ((long)iVar1 - __n),data,__n);
    data[0] = '\0';
    data[1] = '\x02';
    lVar3 = (long)key->bytes - __n;
    sVar6 = lVar3 * 8 + 0x68;
    pmVar4 = mp_new(lVar3 * 8 + 0x70);
    pmVar5 = mp_random_bits_fn(sVar6,random_read);
    mp_copy_into(pmVar4,pmVar5);
    mp_free(pmVar5);
    if (length - key->bytes < -3) {
      lVar3 = 2;
      do {
        mp_mul_integer_into(pmVar4,pmVar4,0xff);
        uVar2 = mp_get_byte(pmVar4,sVar6 >> 3);
        if (uVar2 == 0xff) {
          __assert_fail("byte != 255",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                        ,0x76,"_Bool rsa_ssh1_encrypt(unsigned char *, int, RSAKey *)");
        }
        data[lVar3] = uVar2 + '\x01';
        mp_reduce_mod_2to(pmVar4,sVar6);
        lVar3 = lVar3 + 1;
      } while (lVar3 < key->bytes + ~length);
    }
    mp_free(pmVar4);
    data[~length + key->bytes] = '\0';
    bytes.len = (size_t)key->bytes;
    bytes.ptr = data;
    pmVar4 = mp_from_bytes_be(bytes);
    pmVar5 = mp_modpow(pmVar4,key->exponent,key->modulus);
    sVar6 = (size_t)key->bytes;
    while (sVar6 != 0) {
      sVar6 = sVar6 - 1;
      uVar2 = mp_get_byte(pmVar5,sVar6);
      *data = uVar2;
      data = data + 1;
    }
    mp_free(pmVar4);
    mp_free(pmVar5);
  }
  return length + 4 <= iVar1;
}

Assistant:

bool rsa_ssh1_encrypt(unsigned char *data, int length, RSAKey *key)
{
    mp_int *b1, *b2;
    int i;
    unsigned char *p;

    if (key->bytes < length + 4)
        return false;                  /* RSA key too short! */

    memmove(data + key->bytes - length, data, length);
    data[0] = 0;
    data[1] = 2;

    size_t npad = key->bytes - length - 3;
    /*
     * Generate a sequence of nonzero padding bytes. We do this in a
     * reasonably uniform way and without having to loop round
     * retrying the random number generation, by first generating an
     * integer in [0,2^n) for an appropriately large n; then we
     * repeatedly multiply by 255 to give an integer in [0,255*2^n),
     * extract the top 8 bits to give an integer in [0,255), and mask
     * those bits off before multiplying up again for the next digit.
     * This gives us a sequence of numbers in [0,255), and of course
     * adding 1 to each of them gives numbers in [1,256) as we wanted.
     *
     * (You could imagine this being a sort of fixed-point operation:
     * given a uniformly random binary _fraction_, multiplying it by k
     * and subtracting off the integer part will yield you a sequence
     * of integers each in [0,k). I'm just doing that scaled up by a
     * power of 2 to avoid the fractions.)
     */
    size_t random_bits = (npad + 16) * 8;
    mp_int *randval = mp_new(random_bits + 8);
    mp_int *tmp = mp_random_bits(random_bits);
    mp_copy_into(randval, tmp);
    mp_free(tmp);
    for (i = 2; i < key->bytes - length - 1; i++) {
        mp_mul_integer_into(randval, randval, 255);
        uint8_t byte = mp_get_byte(randval, random_bits / 8);
        assert(byte != 255);
        data[i] = byte + 1;
        mp_reduce_mod_2to(randval, random_bits);
    }
    mp_free(randval);
    data[key->bytes - length - 1] = 0;

    b1 = mp_from_bytes_be(make_ptrlen(data, key->bytes));

    b2 = mp_modpow(b1, key->exponent, key->modulus);

    p = data;
    for (i = key->bytes; i--;) {
        *p++ = mp_get_byte(b2, i);
    }

    mp_free(b1);
    mp_free(b2);

    return true;
}